

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

int al_ustr_find_cset(ALLEGRO_USTR *us,int start_pos,ALLEGRO_USTR *reject)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  uint32_t uc;
  int set_pos;
  int local_2c;
  
  if ((reject != (ALLEGRO_USTR *)0x0) && (0 < reject->slen)) {
    puVar5 = reject->data;
    iVar1 = reject->slen + 1;
    do {
      if ((char)*puVar5 < '\0') {
        iVar1 = 0;
        do {
          while (uVar2 = al_ustr_get(us,iVar1), uVar2 == 0xfffffffe) {
            iVar1 = iVar1 + 1;
          }
          if (uVar2 == 0xffffffff) {
            return -1;
          }
          local_2c = 0;
          do {
            uVar3 = al_ustr_get_next(reject,&local_2c);
            if (uVar3 == 0xffffffff) break;
          } while (uVar2 != uVar3);
          if (uVar3 == 0xffffffff) {
            return iVar1;
          }
          iVar4 = 1;
          if (((0x7f < uVar2) && (iVar4 = 2, 0x7ff < uVar2)) && (iVar4 = 3, 0xffff < uVar2)) {
            iVar4 = (uint)(uVar2 < 0x110000) << 2;
          }
          iVar1 = iVar1 + iVar4;
        } while( true );
      }
      puVar5 = puVar5 + 1;
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  iVar1 = _al_bninchr(us,start_pos,reject);
  return iVar1;
}

Assistant:

int al_ustr_find_cset(const ALLEGRO_USTR *us, int start_pos,
   const ALLEGRO_USTR *reject)
{
   int rc;
   int32_t c, d;
   int pos;
   int set_pos;

   /* Fast path for ASCII characters. */
   if (all_ascii(reject)) {
      rc = _al_bninchr(us, start_pos, reject);
      return (rc == _AL_BSTR_ERR) ? -1 : rc;
   }

   /* Non-ASCII. */
   pos = 0;
   while ((c = al_ustr_get(us, pos)) != -1) {
      if (c == -2) {
         /* Invalid byte sequence. */
         pos++;
         continue;
      }

      set_pos = 0;
      while ((d = al_ustr_get_next(reject, &set_pos)) != -1) {
         if (c == d)
            break;
      }

      if (d == -1) {
         return pos;
      }

      pos += al_utf8_width(c);
   }

   return -1;
}